

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O3

int element6(PROLOG_STATE *state,int tok,char *ptr,char *end,ENCODING *enc)

{
  if (tok < 0x17) {
    if (tok == 0xf) {
      return 0;
    }
    if (tok == 0x12) {
LAB_0015eba0:
      state->handler = element7;
      return 0x2e;
    }
  }
  else {
    switch(tok) {
    case 0x17:
      state->level = state->level + 1;
      return 0x27;
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
      break;
    case 0x1e:
      state->handler = element7;
      return 0x30;
    case 0x1f:
      state->handler = element7;
      return 0x2f;
    case 0x20:
      state->handler = element7;
      return 0x31;
    default:
      if (tok == 0x29) goto LAB_0015eba0;
    }
  }
  if ((tok == 0x1c) && (state->documentEntity == 0)) {
    return 0x34;
  }
  state->handler = error;
  return -1;
}

Assistant:

static
int element6(PROLOG_STATE *state,
             int tok,
             const char *ptr,
             const char *end,
             const ENCODING *enc)
{
  cmExpatUnused(ptr);
  cmExpatUnused(end);
  cmExpatUnused(enc);
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_NONE;
  case XML_TOK_OPEN_PAREN:
    state->level += 1;
    return XML_ROLE_GROUP_OPEN;
  case XML_TOK_NAME:
  case XML_TOK_PREFIXED_NAME:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT;
  case XML_TOK_NAME_QUESTION:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_OPT;
  case XML_TOK_NAME_ASTERISK:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_REP;
  case XML_TOK_NAME_PLUS:
    state->handler = element7;
    return XML_ROLE_CONTENT_ELEMENT_PLUS;
  }
  return common(state, tok);
}